

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_test.cpp
# Opt level: O2

void __thiscall StringPrintf_Precision_Test::TestBody(StringPrintf_Precision_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  AssertionResult gtest_ar_2;
  double dval;
  AssertHelper local_98;
  int length;
  string e;
  float val;
  string pi;
  StringToDoubleConverter local_40;
  
  local_40.flags_ = 1;
  local_40.separator_ = 0;
  local_40.empty_string_value_ = 0.0;
  local_40.junk_string_value_ = 0.0;
  local_40.infinity_symbol_ = (char *)0x0;
  local_40.nan_symbol_ = (char *)0x0;
  e._M_dataplus._M_p._0_4_ = 0x40490fdb;
  pbrt::StringPrintf<float>(&pi,"%f",(float *)&e);
  val = double_conversion::StringToDoubleConverter::StringToFloat
                  (&local_40,pi._M_dataplus._M_p,(int)pi._M_string_length,&length);
  gtest_ar_2._0_8_ = (ulong)(uint)gtest_ar_2._4_4_ << 0x20;
  testing::internal::CmpHelperNE<int,int>((internal *)&e,"0","length",(int *)&gtest_ar_2,&length);
  if ((char)e._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT44(e._M_string_length._4_4_,(int)e._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(e._M_string_length._4_4_,(int)e._M_string_length);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dval,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print_test.cpp"
               ,0x58,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dval,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dval);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&e._M_string_length);
  testing::internal::CmpHelperEQ<float,float>((internal *)&e,"val","Pi",&val,(float *)&pbrt::Pi);
  if ((char)e._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_2);
    if ((undefined8 *)CONCAT44(e._M_string_length._4_4_,(int)e._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(e._M_string_length._4_4_,(int)e._M_string_length);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&dval,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print_test.cpp"
               ,0x59,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&dval,(Message *)&gtest_ar_2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&dval);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_2);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&e._M_string_length);
  gtest_ar_2.success_ = true;
  gtest_ar_2._1_7_ = 0x4005bf0a8b1457;
  pbrt::StringPrintf<double>(&e,"%f",(double *)&gtest_ar_2);
  dval = double_conversion::StringToDoubleConverter::StringToDouble
                   (&local_40,(char *)CONCAT44(e._M_dataplus._M_p._4_4_,e._M_dataplus._M_p._0_4_),
                    (int)e._M_string_length,&length);
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_b8.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)&gtest_ar_2,"0","length",(int *)&local_b8,&length);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print_test.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  local_b8.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4005bf0a8b145769
  ;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar_2,"dval","std::exp(1.)",&dval,(double *)&local_b8);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&local_b8);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print_test.cpp"
               ,0x5e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  std::__cxx11::string::~string((string *)&e);
  std::__cxx11::string::~string((string *)&pi);
  return;
}

Assistant:

TEST(StringPrintf, Precision) {
    double_conversion::StringToDoubleConverter floatParser(
        double_conversion::StringToDoubleConverter::ALLOW_HEX,
        0. /* empty string value */, 0. /* junk string value */,
        nullptr /* infinity symbol */, nullptr /* NaN symbol */);

    std::string pi = StringPrintf("%f", float(Pi));
    int length;
    float val = floatParser.StringToFloat(pi.data(), pi.size(), &length);
    EXPECT_NE(0, length);
    EXPECT_EQ(val, Pi);

    std::string e = StringPrintf("%f", std::exp(1.));
    double dval = floatParser.StringToDouble(e.data(), e.size(), &length);
    EXPECT_NE(0, length);
    EXPECT_EQ(dval, std::exp(1.));
}